

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Expression * __thiscall hdc::Parser::parse_logical_and_expression(Parser *this)

{
  bool bVar1;
  Expression *left;
  Expression *pEVar2;
  Expression *pEVar3;
  Token oper;
  
  oper.lexem._M_dataplus._M_p = (pointer)&oper.lexem.field_2;
  oper.lexem._M_string_length = 0;
  oper.lexem.field_2._M_local_buf[0] = '\0';
  left = parse_equality_expression(this);
  while( true ) {
    while( true ) {
      bVar1 = match(this,TK_AND);
      if (!bVar1) break;
      Token::operator=(&oper,(this->matched)._M_current);
      pEVar2 = (Expression *)operator_new(0x68);
      pEVar3 = parse_equality_expression(this);
      LogicalAndExpression::LogicalAndExpression((LogicalAndExpression *)pEVar2,&oper,left,pEVar3);
      left = pEVar2;
    }
    bVar1 = match(this,TK_LOGICAL_AND);
    if (!bVar1) break;
    Token::operator=(&oper,(this->matched)._M_current);
    pEVar2 = (Expression *)operator_new(0x68);
    pEVar3 = parse_equality_expression(this);
    LogicalAndExpression::LogicalAndExpression((LogicalAndExpression *)pEVar2,&oper,left,pEVar3);
    left = pEVar2;
  }
  std::__cxx11::string::~string((string *)&oper.lexem);
  return left;
}

Assistant:

Expression* Parser::parse_logical_and_expression() {
    Token oper;
    Expression* expression = parse_equality_expression();

    while (true) {
        if (match(TK_AND)) {
            oper = *matched;
            expression = new LogicalAndExpression(oper, expression, parse_equality_expression());
        } else if (match(TK_LOGICAL_AND)) {
            oper = *matched;
            expression = new LogicalAndExpression(oper, expression, parse_equality_expression());
        } else {
            break;
        }
    }

    return expression;
}